

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::UdpDeclarationSyntax::UdpDeclarationSyntax
          (UdpDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token primitive,Token name,UdpPortListSyntax *portList,UdpBodySyntax *body,
          Token endprimitive,NamedBlockClauseSyntax *endBlockName)

{
  Token TVar1;
  UdpPortListSyntax *pUVar2;
  UdpBodySyntax *pUVar3;
  UdpBodySyntax *local_48;
  UdpPortListSyntax *local_40;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  UdpDeclarationSyntax *this_local;
  Token name_local;
  Token primitive_local;
  
  TVar1 = endprimitive;
  name_local._0_8_ = name.info;
  this_local = name._0_8_;
  name_local.info = primitive._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,UdpDeclaration,attributes);
  *(Info **)&this->primitive = name_local.info;
  (this->primitive).info = primitive.info;
  *(UdpDeclarationSyntax **)&this->name = this_local;
  (this->name).info = (Info *)name_local._0_8_;
  local_40 = portList;
  not_null<slang::syntax::UdpPortListSyntax*>::not_null<slang::syntax::UdpPortListSyntax*,void>
            ((not_null<slang::syntax::UdpPortListSyntax*> *)&this->portList,&local_40);
  local_48 = body;
  not_null<slang::syntax::UdpBodySyntax*>::not_null<slang::syntax::UdpBodySyntax*,void>
            ((not_null<slang::syntax::UdpBodySyntax*> *)&this->body,&local_48);
  (this->endprimitive).kind = endprimitive.kind;
  (this->endprimitive).field_0x2 = endprimitive._2_1_;
  (this->endprimitive).numFlags = (NumericTokenFlags)endprimitive.numFlags.raw;
  (this->endprimitive).rawLen = endprimitive.rawLen;
  endprimitive.info = TVar1.info;
  (this->endprimitive).info = endprimitive.info;
  this->endBlockName = endBlockName;
  pUVar2 = not_null<slang::syntax::UdpPortListSyntax_*>::operator->(&this->portList);
  (pUVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  pUVar3 = not_null<slang::syntax::UdpBodySyntax_*>::operator->(&this->body);
  (pUVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

UdpDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token primitive, Token name, UdpPortListSyntax& portList, UdpBodySyntax& body, Token endprimitive, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::UdpDeclaration, attributes), primitive(primitive), name(name), portList(&portList), body(&body), endprimitive(endprimitive), endBlockName(endBlockName) {
        this->portList->parent = this;
        this->body->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }